

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void nghttp2_stream_dep_remove_subtree(nghttp2_stream *stream)

{
  nghttp2_stream *dep_stream;
  nghttp2_stream *stream_00;
  nghttp2_stream *dep_prev;
  nghttp2_stream *next;
  nghttp2_stream *stream_local;
  
  if (stream->dep_prev == (nghttp2_stream *)0x0) {
    __assert_fail("stream->dep_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x38a,"void nghttp2_stream_dep_remove_subtree(nghttp2_stream *)");
  }
  dep_stream = stream->dep_prev;
  if (stream->sib_prev == (nghttp2_stream *)0x0) {
    stream_00 = stream->sib_next;
    link_dep(dep_stream,stream_00);
    if (stream_00 != (nghttp2_stream *)0x0) {
      stream_00->sib_prev = (nghttp2_stream *)0x0;
    }
  }
  else {
    link_sib(stream->sib_prev,stream->sib_next);
  }
  dep_stream->sum_dep_weight = dep_stream->sum_dep_weight - stream->weight;
  if (stream->queued != '\0') {
    stream_obq_remove(stream);
  }
  validate_tree(dep_stream);
  stream->sib_prev = (nghttp2_stream *)0x0;
  stream->sib_next = (nghttp2_stream *)0x0;
  stream->dep_prev = (nghttp2_stream *)0x0;
  return;
}

Assistant:

void nghttp2_stream_dep_remove_subtree(nghttp2_stream *stream) {
  nghttp2_stream *next, *dep_prev;

  DEBUGF("stream: dep_remove_subtree stream(%p)=%d\n", stream,
         stream->stream_id);

  assert(stream->dep_prev);

  dep_prev = stream->dep_prev;

  if (stream->sib_prev) {
    link_sib(stream->sib_prev, stream->sib_next);
  } else {
    next = stream->sib_next;

    link_dep(dep_prev, next);

    if (next) {
      next->sib_prev = NULL;
    }
  }

  dep_prev->sum_dep_weight -= stream->weight;

  if (stream->queued) {
    stream_obq_remove(stream);
  }

  validate_tree(dep_prev);

  stream->sib_prev = NULL;
  stream->sib_next = NULL;
  stream->dep_prev = NULL;
}